

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O3

Mat3x3d * __thiscall
OpenMD::Thermo::getSystemQuadrupole(Mat3x3d *__return_storage_ptr__,Thermo *this)

{
  double dVar1;
  Atom *this_00;
  RealType RVar2;
  Molecule *pMVar3;
  bool bVar4;
  uint i;
  Molecule *pMVar5;
  long lVar6;
  double *pdVar7;
  double (*padVar8) [3];
  uint i_1;
  double *pdVar9;
  uint j;
  long lVar10;
  Snapshot *this_01;
  pointer ppAVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  double dVar14;
  MultipoleAdapter ma;
  FixedChargeAdapter fca;
  RectMatrix<double,_3U,_3U> result_1;
  SquareMatrix3<double> result;
  FluctuatingChargeAdapter fqa;
  MoleculeIterator miter;
  Mat3x3d qpole;
  Vector3d local_1e8;
  Snapshot *local_1c8;
  double local_1c0;
  MultipoleAdapter local_1b8;
  FixedChargeAdapter local_1b0;
  double local_1a8 [10];
  double local_158 [9];
  Mat3x3d *local_110;
  Thermo *local_108;
  Molecule *local_100;
  FluctuatingChargeAdapter local_f8;
  MoleculeIterator local_f0;
  double local_e8 [4];
  Mat3x3d local_c8;
  double local_78 [9];
  
  this_01 = this->info_->sman_->currentSnapshot_;
  local_108 = this;
  if (this_01->hasSystemQuadrupole == false) {
    local_f0._M_node = (_Base_ptr)0x0;
    local_1e8.super_Vector<double,_3U>.data_[2] = 0.0;
    local_1e8.super_Vector<double,_3U>.data_[0] = 0.0;
    local_1e8.super_Vector<double,_3U>.data_[1] = 0.0;
    local_c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] = 0.0;
    local_c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
    local_c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
    local_c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] = 0.0;
    local_c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
    local_c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
    local_c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
    local_c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
    local_c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
    local_1c8 = this_01;
    local_110 = __return_storage_ptr__;
    pMVar5 = SimInfo::beginMolecule(this->info_,&local_f0);
    if (pMVar5 != (Molecule *)0x0) {
      do {
        ppAVar11 = (pMVar5->atoms_).
                   super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        pMVar3 = local_100;
        if (ppAVar11 !=
            (pMVar5->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          this_00 = *ppAVar11;
          local_100 = pMVar5;
          while (this_00 != (Atom *)0x0) {
            lVar10 = (long)(this_00->super_StuntDouble).localIndex_;
            lVar6 = *(long *)((long)&(((this_00->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                     ->atomData).position.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start +
                             (this_00->super_StuntDouble).storage_);
            pdVar7 = (double *)(lVar6 + lVar10 * 0x18);
            local_1e8.super_Vector<double,_3U>.data_[0] = *pdVar7;
            local_1e8.super_Vector<double,_3U>.data_[1] = pdVar7[1];
            local_1e8.super_Vector<double,_3U>.data_[2] = *(double *)(lVar6 + 0x10 + lVar10 * 0x18);
            Snapshot::wrapVector(local_1c8,&local_1e8);
            lVar6 = 0;
            do {
              local_1e8.super_Vector<double,_3U>.data_[lVar6] =
                   local_1e8.super_Vector<double,_3U>.data_[lVar6] * 1e-10;
              lVar6 = lVar6 + 1;
            } while (lVar6 != 3);
            local_1b0.at_ = this_00->atomType_;
            bVar4 = FixedChargeAdapter::isFixedCharge(&local_1b0);
            uVar12 = 0;
            uVar13 = 0;
            if (bVar4) {
              RVar2 = FixedChargeAdapter::getCharge(&local_1b0);
              uVar12 = SUB84(RVar2,0);
              uVar13 = (undefined4)((ulong)RVar2 >> 0x20);
            }
            local_1c0 = (double)CONCAT44(uVar13,uVar12);
            local_f8.at_ = this_00->atomType_;
            bVar4 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_f8);
            dVar14 = local_1c0;
            if (bVar4) {
              dVar14 = local_1c0 +
                       *(double *)
                        (*(long *)((long)&(((this_00->super_StuntDouble).snapshotMan_)->
                                           currentSnapshot_->atomData).flucQPos.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start +
                                  (this_00->super_StuntDouble).storage_) +
                        (long)(this_00->super_StuntDouble).localIndex_ * 8);
            }
            local_158[6] = 0.0;
            local_158[7] = 0.0;
            local_158[4] = 0.0;
            local_158[5] = 0.0;
            local_158[2] = 0.0;
            local_158[3] = 0.0;
            local_158[0] = 0.0;
            local_158[1] = 0.0;
            local_158[8] = 0.0;
            lVar6 = 0;
            pdVar7 = local_158;
            do {
              dVar1 = local_1e8.super_Vector<double,_3U>.data_[lVar6];
              lVar10 = 0;
              do {
                pdVar7[lVar10] = local_1e8.super_Vector<double,_3U>.data_[lVar10] * dVar1;
                lVar10 = lVar10 + 1;
              } while (lVar10 != 3);
              lVar6 = lVar6 + 1;
              pdVar7 = pdVar7 + 3;
            } while (lVar6 != 3);
            local_1a8[6] = 0.0;
            local_1a8[7] = 0.0;
            local_1a8[4] = 0.0;
            local_1a8[5] = 0.0;
            local_1a8[2] = 0.0;
            local_1a8[3] = 0.0;
            local_1a8[0] = 0.0;
            local_1a8[1] = 0.0;
            local_1a8[8] = 0.0;
            lVar6 = 0;
            pdVar7 = local_158;
            pdVar9 = local_1a8;
            do {
              lVar10 = 0;
              do {
                pdVar9[lVar10] = pdVar7[lVar10] * dVar14 * 1.60217733e-19 * 0.5;
                lVar10 = lVar10 + 1;
              } while (lVar10 != 3);
              lVar6 = lVar6 + 1;
              pdVar9 = pdVar9 + 3;
              pdVar7 = pdVar7 + 3;
            } while (lVar6 != 3);
            lVar6 = 0;
            pdVar7 = local_1a8;
            padVar8 = (double (*) [3])&local_c8;
            do {
              lVar10 = 0;
              do {
                (((SquareMatrix<double,_3> *)*padVar8)->super_RectMatrix<double,_3U,_3U>).data_[0]
                [lVar10] = pdVar7[lVar10] +
                           (((SquareMatrix<double,_3> *)*padVar8)->super_RectMatrix<double,_3U,_3U>)
                           .data_[0][lVar10];
                lVar10 = lVar10 + 1;
              } while (lVar10 != 3);
              lVar6 = lVar6 + 1;
              padVar8 = padVar8 + 1;
              pdVar7 = pdVar7 + 3;
            } while (lVar6 != 3);
            local_1b8.at_ = this_00->atomType_;
            bVar4 = MultipoleAdapter::isDipole(&local_1b8);
            if (bVar4) {
              lVar10 = (long)(this_00->super_StuntDouble).localIndex_;
              lVar6 = *(long *)((long)&(((this_00->super_StuntDouble).snapshotMan_)->
                                        currentSnapshot_->atomData).dipole.
                                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start +
                               (this_00->super_StuntDouble).storage_);
              local_158[2] = (double)*(undefined8 *)(lVar6 + 0x10 + lVar10 * 0x18);
              pdVar7 = (double *)(lVar6 + lVar10 * 0x18);
              local_158[0] = *pdVar7;
              local_158[1] = pdVar7[1];
              local_1a8[0] = 0.0;
              local_1a8[1] = 0.0;
              local_1a8[2] = 0.0;
              lVar6 = 0;
              do {
                local_1a8[lVar6] = local_158[lVar6] * 3.33564095198e-30;
                lVar6 = lVar6 + 1;
              } while (lVar6 != 3);
              local_e8[2] = local_1a8[2];
              local_e8[0] = local_1a8[0];
              local_e8[1] = local_1a8[1];
              local_158[6] = 0.0;
              local_158[7] = 0.0;
              local_158[4] = 0.0;
              local_158[5] = 0.0;
              local_158[2] = 0.0;
              local_158[3] = 0.0;
              local_158[0] = 0.0;
              local_158[1] = 0.0;
              local_158[8] = 0.0;
              lVar6 = 0;
              pdVar7 = local_158;
              do {
                dVar14 = local_e8[lVar6];
                lVar10 = 0;
                do {
                  pdVar7[lVar10] = local_1e8.super_Vector<double,_3U>.data_[lVar10] * dVar14;
                  lVar10 = lVar10 + 1;
                } while (lVar10 != 3);
                lVar6 = lVar6 + 1;
                pdVar7 = pdVar7 + 3;
              } while (lVar6 != 3);
              local_1a8[6] = 0.0;
              local_1a8[7] = 0.0;
              local_1a8[4] = 0.0;
              local_1a8[5] = 0.0;
              local_1a8[2] = 0.0;
              local_1a8[3] = 0.0;
              local_1a8[0] = 0.0;
              local_1a8[1] = 0.0;
              local_1a8[8] = 0.0;
              lVar6 = 0;
              pdVar7 = local_158;
              pdVar9 = local_1a8;
              do {
                lVar10 = 0;
                do {
                  pdVar9[lVar10] = pdVar7[lVar10] * 0.5;
                  lVar10 = lVar10 + 1;
                } while (lVar10 != 3);
                lVar6 = lVar6 + 1;
                pdVar9 = pdVar9 + 3;
                pdVar7 = pdVar7 + 3;
              } while (lVar6 != 3);
              lVar6 = 0;
              pdVar7 = local_1a8;
              padVar8 = (double (*) [3])&local_c8;
              do {
                lVar10 = 0;
                do {
                  (*padVar8)[lVar10] = pdVar7[lVar10] + (*padVar8)[lVar10];
                  lVar10 = lVar10 + 1;
                } while (lVar10 != 3);
                lVar6 = lVar6 + 1;
                padVar8 = padVar8 + 1;
                pdVar7 = pdVar7 + 3;
              } while (lVar6 != 3);
              local_158[6] = 0.0;
              local_158[7] = 0.0;
              local_158[4] = 0.0;
              local_158[5] = 0.0;
              local_158[2] = 0.0;
              local_158[3] = 0.0;
              local_158[0] = 0.0;
              local_158[1] = 0.0;
              local_158[8] = 0.0;
              lVar6 = 0;
              pdVar7 = local_158;
              do {
                dVar14 = local_1e8.super_Vector<double,_3U>.data_[lVar6];
                lVar10 = 0;
                do {
                  pdVar7[lVar10] = local_e8[lVar10] * dVar14;
                  lVar10 = lVar10 + 1;
                } while (lVar10 != 3);
                lVar6 = lVar6 + 1;
                pdVar7 = pdVar7 + 3;
              } while (lVar6 != 3);
              local_1a8[6] = 0.0;
              local_1a8[7] = 0.0;
              local_1a8[4] = 0.0;
              local_1a8[5] = 0.0;
              local_1a8[2] = 0.0;
              local_1a8[3] = 0.0;
              local_1a8[0] = 0.0;
              local_1a8[1] = 0.0;
              local_1a8[8] = 0.0;
              lVar6 = 0;
              pdVar7 = local_158;
              pdVar9 = local_1a8;
              do {
                lVar10 = 0;
                do {
                  pdVar9[lVar10] = pdVar7[lVar10] * 0.5;
                  lVar10 = lVar10 + 1;
                } while (lVar10 != 3);
                lVar6 = lVar6 + 1;
                pdVar9 = pdVar9 + 3;
                pdVar7 = pdVar7 + 3;
              } while (lVar6 != 3);
              lVar6 = 0;
              pdVar7 = local_1a8;
              padVar8 = (double (*) [3])&local_c8;
              do {
                lVar10 = 0;
                do {
                  (*padVar8)[lVar10] = pdVar7[lVar10] + (*padVar8)[lVar10];
                  lVar10 = lVar10 + 1;
                } while (lVar10 != 3);
                lVar6 = lVar6 + 1;
                padVar8 = padVar8 + 1;
                pdVar7 = pdVar7 + 3;
              } while (lVar6 != 3);
            }
            bVar4 = MultipoleAdapter::isQuadrupole(&local_1b8);
            if (bVar4) {
              padVar8 = (double (*) [3])local_78;
              StuntDouble::getQuadrupole((Mat3x3d *)padVar8,&this_00->super_StuntDouble);
              local_158[6] = 0.0;
              local_158[7] = 0.0;
              local_158[4] = 0.0;
              local_158[5] = 0.0;
              local_158[2] = 0.0;
              local_158[3] = 0.0;
              local_158[0] = 0.0;
              local_158[1] = 0.0;
              local_158[8] = 0.0;
              lVar6 = 0;
              pdVar7 = local_158;
              do {
                lVar10 = 0;
                do {
                  pdVar7[lVar10] =
                       (((SquareMatrix<double,_3> *)*padVar8)->super_RectMatrix<double,_3U,_3U>).
                       data_[0][lVar10] * 3.33564095198e-30;
                  pMVar5 = local_100;
                  lVar10 = lVar10 + 1;
                } while (lVar10 != 3);
                lVar6 = lVar6 + 1;
                pdVar7 = pdVar7 + 3;
                padVar8 = padVar8 + 1;
              } while (lVar6 != 3);
              local_1a8[6] = 0.0;
              local_1a8[7] = 0.0;
              local_1a8[4] = 0.0;
              local_1a8[5] = 0.0;
              local_1a8[2] = 0.0;
              local_1a8[3] = 0.0;
              local_1a8[0] = 0.0;
              local_1a8[1] = 0.0;
              local_1a8[8] = 0.0;
              lVar6 = 0;
              pdVar7 = local_158;
              pdVar9 = local_1a8;
              do {
                lVar10 = 0;
                do {
                  pdVar9[lVar10] = pdVar7[lVar10] * 1e-10;
                  lVar10 = lVar10 + 1;
                } while (lVar10 != 3);
                lVar6 = lVar6 + 1;
                pdVar9 = pdVar9 + 3;
                pdVar7 = pdVar7 + 3;
              } while (lVar6 != 3);
              lVar6 = 0;
              pdVar7 = local_1a8;
              padVar8 = (double (*) [3])&local_c8;
              do {
                lVar10 = 0;
                do {
                  (*padVar8)[lVar10] = pdVar7[lVar10] + (*padVar8)[lVar10];
                  lVar10 = lVar10 + 1;
                } while (lVar10 != 3);
                lVar6 = lVar6 + 1;
                padVar8 = padVar8 + 1;
                pdVar7 = pdVar7 + 3;
              } while (lVar6 != 3);
            }
            ppAVar11 = ppAVar11 + 1;
            pMVar3 = local_100;
            if (ppAVar11 ==
                (pMVar5->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                ._M_impl.super__Vector_impl_data._M_finish) break;
            this_00 = *ppAVar11;
          }
        }
        local_100 = pMVar3;
        pMVar5 = SimInfo::nextMolecule(local_108->info_,&local_f0);
      } while (pMVar5 != (Molecule *)0x0);
    }
    this_01 = local_1c8;
    Snapshot::setSystemQuadrupole(local_1c8,&local_c8);
    __return_storage_ptr__ = local_110;
  }
  Snapshot::getSystemQuadrupole(__return_storage_ptr__,this_01);
  return __return_storage_ptr__;
}

Assistant:

Mat3x3d Thermo::getSystemQuadrupole() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasSystemQuadrupole) {
      SimInfo::MoleculeIterator miter;
      vector<Atom*>::iterator aiter;
      Molecule* mol;
      Atom* atom;
      RealType charge;
      Vector3d ri(0.0);
      Vector3d dipole(0.0);
      Mat3x3d qpole(0.0);

      RealType chargeToC   = 1.60217733e-19;
      RealType angstromToM = 1.0e-10;
      RealType debyeToCm   = 3.33564095198e-30;

      for (mol = info_->beginMolecule(miter); mol != NULL;
           mol = info_->nextMolecule(miter)) {
        for (atom = mol->beginAtom(aiter); atom != NULL;
             atom = mol->nextAtom(aiter)) {
          ri = atom->getPos();
          snap->wrapVector(ri);
          ri *= angstromToM;

          charge = 0.0;

          FixedChargeAdapter fca = FixedChargeAdapter(atom->getAtomType());
          if (fca.isFixedCharge()) { charge = fca.getCharge(); }

          FluctuatingChargeAdapter fqa =
              FluctuatingChargeAdapter(atom->getAtomType());
          if (fqa.isFluctuatingCharge()) { charge += atom->getFlucQPos(); }

          charge *= chargeToC;

          qpole += 0.5 * charge * outProduct(ri, ri);

          MultipoleAdapter ma = MultipoleAdapter(atom->getAtomType());

          if (ma.isDipole()) {
            dipole = atom->getDipole() * debyeToCm;
            qpole += 0.5 * outProduct(dipole, ri);
            qpole += 0.5 * outProduct(ri, dipole);
          }

          if (ma.isQuadrupole()) {
            qpole += atom->getQuadrupole() * debyeToCm * angstromToM;
          }
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, qpole.getArrayPointer(), 9, MPI_REALTYPE,
                    MPI_SUM, MPI_COMM_WORLD);
#endif

      snap->setSystemQuadrupole(qpole);
    }

    return snap->getSystemQuadrupole();
  }